

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kitDsd.c
# Opt level: O2

Kit_DsdNtk_t * Kit_DsdDecomposeInt(uint *pTruth,int nVars,int nDecMux)

{
  Kit_DsdObj_t **ppKVar1;
  int iVar2;
  uint uWord;
  Kit_DsdNtk_t *pNtk;
  Kit_DsdObj_t *pKVar3;
  unsigned_short *pPar;
  ulong uVar4;
  uint *pOut;
  ulong uVar5;
  
  if (0x10 < nVars) {
    __assert_fail("nVars <= 16",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bool/kit/kitDsd.c"
                  ,0x8e1,"Kit_DsdNtk_t *Kit_DsdDecomposeInt(unsigned int *, int, int)");
  }
  pNtk = Kit_DsdNtkAlloc(nVars);
  uVar4 = 0;
  iVar2 = Abc_Var2Lit((uint)pNtk->nVars,0);
  pNtk->Root = (unsigned_short)iVar2;
  pKVar3 = Kit_DsdObjAlloc(pNtk,KIT_DSD_PRIME,nVars);
  ppKVar1 = pNtk->pNodes;
  if (*ppKVar1 == pKVar3) {
    pPar = &pNtk->Root;
    uVar5 = 0;
    if (0 < nVars) {
      uVar5 = (ulong)(uint)nVars;
    }
    for (; uVar5 != uVar4; uVar4 = uVar4 + 1) {
      iVar2 = Abc_Var2Lit((int)uVar4,0);
      *(short *)(&pKVar3[1].field_0x0 + uVar4 * 2) = (short)iVar2;
    }
    pOut = (uint *)0x0;
    if (((uint)*pKVar3 & 0x1c0) == 0x140) {
      pOut = (uint *)(&pKVar3[1].field_0x0 + ((uint)*pKVar3 >> 8 & 0x3fc));
    }
    Kit_TruthCopy(pOut,pTruth,nVars);
    uWord = Kit_TruthSupport(pTruth,nVars);
    iVar2 = Kit_WordCountOnes(uWord);
    if (iVar2 == 1) {
      *pKVar3 = (Kit_DsdObj_t)((uint)*pKVar3 & 0x3fffe3f | 0x4000080);
      iVar2 = Kit_WordFindFirstBit(uWord);
      iVar2 = Abc_Var2Lit(iVar2,*pTruth & 1);
      *(short *)(pKVar3 + 1) = (short)iVar2;
    }
    else if (iVar2 == 0) {
      *pKVar3 = (Kit_DsdObj_t)((uint)*pKVar3 & 0x3fffe3f | 0x40);
      if (*pTruth == 0) {
        iVar2 = Abc_LitNot((uint)*pPar);
        *pPar = (unsigned_short)iVar2;
      }
    }
    else {
      Kit_DsdDecompose_rec(pNtk,*ppKVar1,uWord,pPar,nDecMux);
    }
    return pNtk;
  }
  __assert_fail("pNtk->pNodes[0] == pObj",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bool/kit/kitDsd.c"
                ,0x8e6,"Kit_DsdNtk_t *Kit_DsdDecomposeInt(unsigned int *, int, int)");
}

Assistant:

Kit_DsdNtk_t * Kit_DsdDecomposeInt( unsigned * pTruth, int nVars, int nDecMux )
{
    Kit_DsdNtk_t * pNtk;
    Kit_DsdObj_t * pObj;
    unsigned uSupp;
    int i, nVarsReal;
    assert( nVars <= 16 );
    pNtk = Kit_DsdNtkAlloc( nVars );
    pNtk->Root = Abc_Var2Lit( pNtk->nVars, 0 );
    // create the first node
    pObj = Kit_DsdObjAlloc( pNtk, KIT_DSD_PRIME, nVars );
    assert( pNtk->pNodes[0] == pObj );
    for ( i = 0; i < nVars; i++ )
       pObj->pFans[i] = Abc_Var2Lit( i, 0 );
    Kit_TruthCopy( Kit_DsdObjTruth(pObj), pTruth, nVars );
    uSupp = Kit_TruthSupport( pTruth, nVars );
    // consider special cases
    nVarsReal = Kit_WordCountOnes( uSupp );
    if ( nVarsReal == 0 )
    {
        pObj->Type = KIT_DSD_CONST1;
        pObj->nFans = 0;
        if ( pTruth[0] == 0 )
             pNtk->Root = Abc_LitNot(pNtk->Root);
        return pNtk;
    }
    if ( nVarsReal == 1 )
    {
        pObj->Type = KIT_DSD_VAR;
        pObj->nFans = 1;
        pObj->pFans[0] = Abc_Var2Lit( Kit_WordFindFirstBit(uSupp), (pTruth[0] & 1) );
        return pNtk;
    }
    Kit_DsdDecompose_rec( pNtk, pNtk->pNodes[0], uSupp, &pNtk->Root, nDecMux );
    return pNtk;
}